

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall DecisionNode::orderPatterns(DecisionNode *this,DecisionProperties *props)

{
  DisjointPattern *pDVar1;
  DisjointPattern *pDVar2;
  Constructor *a;
  Constructor *b;
  DisjointPattern *this_00;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  Constructor *pCVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  conflictlist;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  newlist;
  pair<DisjointPattern_*,_Constructor_*> *local_88;
  iterator iStack_80;
  pair<DisjointPattern_*,_Constructor_*> *local_78;
  Constructor *local_70;
  pair<DisjointPattern_*,_Constructor_*> local_68;
  long local_58;
  DecisionProperties *local_50;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  local_88 = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  iStack_80._M_current = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  local_50 = props;
  if ((this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        lVar12 = 0;
        uVar11 = uVar7;
        do {
          ppVar5 = (this->list).
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = DisjointPattern::identical
                            (ppVar5[uVar7].first,
                             *(DisjointPattern **)((long)&ppVar5->first + lVar12));
          if (bVar3) {
            ppVar5 = (this->list).
                     super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            DecisionProperties::identicalPattern
                      (local_50,ppVar5[uVar7].second,
                       *(Constructor **)((long)&ppVar5->second + lVar12));
          }
          lVar12 = lVar12 + 0x10;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(this->list).
                                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->list).
                                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::operator=(&local_48,&this->list);
  if ((this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_58 = 0;
    uVar7 = 0;
    do {
      uVar11 = 0;
      if (uVar7 != 0) {
        lVar12 = 0;
        uVar8 = 0;
        do {
          pDVar1 = local_48.
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
          pDVar2 = *(DisjointPattern **)
                    ((long)&((this->list).
                             super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar12);
          bVar3 = DisjointPattern::specializes(pDVar1,pDVar2);
          uVar11 = uVar8;
          if (bVar3) break;
          bVar4 = DisjointPattern::specializes(pDVar2,pDVar1);
          if (!bVar4) {
            pCVar9 = local_48.
                     super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
            local_70 = *(Constructor **)
                        ((long)&((this->list).
                                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->second + lVar12);
            if (pCVar9 != local_70) {
              if (iStack_80._M_current == local_78) {
                local_68.first = pDVar1;
                local_68.second = pCVar9;
                std::
                vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                ::_M_realloc_insert<std::pair<DisjointPattern*,Constructor*>>
                          ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                            *)&local_88,iStack_80,&local_68);
              }
              else {
                (iStack_80._M_current)->first = pDVar1;
                (iStack_80._M_current)->second = pCVar9;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
              local_68.second = local_70;
              local_68.first = pDVar2;
              if (iStack_80._M_current == local_78) {
                std::
                vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                ::_M_realloc_insert<std::pair<DisjointPattern*,Constructor*>>
                          ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                            *)&local_88,iStack_80,&local_68);
              }
              else {
                (iStack_80._M_current)->first = pDVar2;
                (iStack_80._M_current)->second = local_70;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
            }
          }
          if (bVar3) break;
          uVar8 = uVar8 + 1;
          lVar12 = lVar12 + 0x10;
          uVar11 = uVar7;
        } while (uVar7 != uVar8);
      }
      uVar8 = uVar11 & 0xffffffff;
      if (uVar8 < uVar7) {
        puVar6 = (undefined8 *)
                 ((long)&((this->list).
                          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + local_58);
        uVar10 = uVar7;
        do {
          uVar10 = uVar10 - 1;
          *puVar6 = puVar6[-2];
          puVar6[1] = puVar6[-1];
          puVar6 = puVar6 + -2;
        } while ((long)(int)uVar11 < (long)uVar10);
      }
      ppVar5 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5[uVar8].first =
           local_48.
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
      ppVar5[uVar8].second =
           local_48.
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
      uVar7 = uVar7 + 1;
      local_58 = local_58 + 0x10;
    } while (uVar7 < (ulong)((long)(this->list).
                                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->list).
                                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (iStack_80._M_current != local_88) {
    pCVar9 = (Constructor *)0x0;
    do {
      a = local_88[(long)pCVar9].second;
      b = local_88[(long)((long)&pCVar9->pattern + 1)].second;
      ppVar5 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->list).
          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == ppVar5) {
LAB_003243e1:
        DecisionProperties::conflictingPattern(local_50,a,b);
      }
      else {
        pDVar1 = local_88[(long)pCVar9].first;
        pDVar2 = local_88[(long)((long)&pCVar9->pattern + 1)].first;
        lVar12 = 8;
        uVar7 = 0;
        bVar3 = false;
        local_70 = pCVar9;
        do {
          this_00 = *(DisjointPattern **)((long)ppVar5 + lVar12 + -8);
          pCVar9 = *(Constructor **)((long)&ppVar5->first + lVar12);
          if (((this_00 == pDVar1) && (pCVar9 == a)) || ((this_00 == pDVar2 && (pCVar9 == b)))) {
            bVar4 = false;
          }
          else {
            bVar4 = DisjointPattern::resolvesIntersect(this_00,pDVar1,pDVar2);
            if (bVar4) {
              bVar3 = true;
            }
            bVar4 = !bVar4;
          }
          if (!bVar4) break;
          uVar7 = uVar7 + 1;
          ppVar5 = (this->list).
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x10;
        } while (uVar7 < (ulong)((long)(this->list).
                                       super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >>
                                4));
        pCVar9 = local_70;
        if (!bVar3) goto LAB_003243e1;
      }
      pCVar9 = (Constructor *)((long)&pCVar9->pattern + 2);
    } while (pCVar9 < (Constructor *)((long)iStack_80._M_current - (long)local_88 >> 4));
  }
  if (local_88 != (pair<DisjointPattern_*,_Constructor_*> *)0x0) {
    operator_delete(local_88);
  }
  if (local_48.
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DecisionNode::orderPatterns(DecisionProperties &props)

{
  // This is a tricky routine.  When this routine is called, the patterns remaining in the
  // the decision node can no longer be distinguished by examining additional bits. The basic
  // idea here is that the patterns should be ordered so that the most specialized should come
  // first in the list. Pattern 1 is a specialization of pattern 2, if the set of instructions
  // matching 1 is contained in the set matching 2.  So in the simplest case, the pattern order
  // should represent a strict nesting.  Unfortunately, there are many potential situations where
  // patterns don't necessarily nest.
  //   1) An "or" of two patterns.  This can be an explicit '|' operator in the Constructor, in
  //      which case this can be detected because the two patterns point to the same constructor
  //      But the "or" can be implied across two constructors that do the same thing.  This should
  //      probably be flagged as an error except in the following case.
  //   2) Two patterns aren't properly nested, but they are "resolved" by a third pattern which
  //      covers the intersection of the first two patterns.  Sometimes its easier to specify
  //      three cases that need to be distinguished in this way.
  //   3) Recursive constructors that use a "guard" context bit.  The guard bit is used to prevent
  //      the recursive constructor from matching repeatedly, but it's too much work to put a
  //      constraint an the bit for every other pattern.
  //   4) Other situations where the ability to distinguish between constructors is hidden in
  //      the subconstructors.
  // This routine can determine if an intersection results from case 1) or case 2)
  int4 i,j,k;
  vector<pair<DisjointPattern *,Constructor *> > newlist;
  vector<pair<DisjointPattern *,Constructor *> > conflictlist;

  // Check for identical patterns
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = list[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->identical(jpat))
	props.identicalPattern(list[i].second,list[j].second);
    }
  }

  newlist = list;
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = newlist[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->specializes(jpat))
	break;
      if (!jpat->specializes(ipat)) { // We have a potential conflict
	Constructor *iconst = newlist[i].second;
	Constructor *jconst = list[j].second;
	if (iconst == jconst) { // This is an OR in the pattern for ONE constructor
	  // So there is no conflict
	}
	else {			// A true conflict that needs to be resolved
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(ipat,iconst));
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(jpat,jconst));
	}
      }
    }
    for(k=i-1;k>=j;--k)
      list[k+1] = list[k];
    list[j] = newlist[i];
  }
  
  // Check if intersection patterns are present, which resolve conflicts
  for(i=0;i<conflictlist.size();i+=2) {
    DisjointPattern *pat1,*pat2;
    Constructor *const1,*const2;
    pat1 = conflictlist[i].first;
    const1 = conflictlist[i].second;
    pat2 = conflictlist[i+1].first;
    const2 = conflictlist[i+1].second;
    bool resolved = false;
    for(j=0;j<list.size();++j) {
      DisjointPattern *tpat = list[j].first;
      Constructor *tconst = list[j].second;
      if ((tpat == pat1)&&(tconst==const1)) break; // Ran out of possible specializations
      if ((tpat == pat2)&&(tconst==const2)) break;
      if (tpat->resolvesIntersect(pat1,pat2)) {
	resolved = true;
	break;
      }
    }
    if (!resolved)
      props.conflictingPattern(const1,const2);
  }
}